

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

IResultCapture * Catch::getResultCapture(void)

{
  Context *pCVar1;
  ReusableStringStream RStack_48;
  string local_38;
  SourceLineInfo local_18;
  
  pCVar1 = getCurrentContext();
  if (pCVar1->m_resultCapture != (IResultCapture *)0x0) {
    return pCVar1->m_resultCapture;
  }
  ReusableStringStream::ReusableStringStream(&RStack_48);
  local_18.file =
       "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
  ;
  local_18.line = 0x166f;
  operator<<(RStack_48.m_oss,&local_18);
  std::operator<<(RStack_48.m_oss,": Internal Catch2 error: ");
  std::operator<<(RStack_48.m_oss,"No result capture instance");
  std::__cxx11::stringbuf::str();
  throw_logic_error(&local_38);
}

Assistant:

IResultCapture& getResultCapture() {
        if (auto* capture = getCurrentContext().getResultCapture())
            return *capture;
        else
            CATCH_INTERNAL_ERROR("No result capture instance");
    }